

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CZ.hpp
# Opt level: O3

void __thiscall qclab::qgates::CZ<float>::CZ(CZ<float> *this)

{
  PauliZ<float> *pPVar1;
  
  (this->super_QControlledGate2<float>).control_ = 0;
  (this->super_QControlledGate2<float>).controlState_ = 1;
  (this->super_QControlledGate2<float>).super_QGate2<float>.super_QObject<float>._vptr_QObject =
       (_func_int **)&PTR_nbQubits_001359b0;
  pPVar1 = (PauliZ<float> *)operator_new(0x10);
  (pPVar1->super_QGate1<float>).qubit_ = 1;
  (pPVar1->super_QGate1<float>).super_QObject<float> = (QObject<float>)&PTR_nbQubits_00134c60;
  (this->gate_)._M_t.
  super___uniq_ptr_impl<qclab::qgates::PauliZ<float>,_std::default_delete<qclab::qgates::PauliZ<float>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_qclab::qgates::PauliZ<float>_*,_std::default_delete<qclab::qgates::PauliZ<float>_>_>
  .super__Head_base<0UL,_qclab::qgates::PauliZ<float>_*,_false>._M_head_impl = pPVar1;
  return;
}

Assistant:

CZ()
        : QControlledGate2< T >( 0 )
        , gate_( std::make_unique< PauliZ< T > >( 1 ) )
        { }